

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_sse_harley_seal_improved(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [16];
  ushort uVar2;
  uint uVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int j;
  long lVar8;
  undefined1 (*pauVar9) [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint16_t auVar19 [8];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  uint16_t buffer [8];
  __m128i counter [4];
  
  for (uVar3 = len & 0xffffff80; uVar3 < len; uVar3 = uVar3 + 1) {
    uVar2 = array[uVar3];
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      flags[lVar8] = flags[lVar8] + (uint)((uVar2 >> ((uint)lVar8 & 0x1f) & 1) != 0);
    }
  }
  uVar5 = (ulong)(len >> 3 & 0xfffffff0);
  for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 0x10) {
    *(undefined1 (*) [16])((long)counter[0] + lVar8) = (undefined1  [16])0x0;
  }
  auVar25._8_2_ = 0x5555;
  auVar25._0_8_ = 0x5555555555555555;
  auVar25._10_2_ = 0x5555;
  auVar25._12_2_ = 0x5555;
  auVar25._14_2_ = 0x5555;
  auVar23._8_2_ = 0x3333;
  auVar23._0_8_ = 0x3333333333333333;
  auVar23._10_2_ = 0x3333;
  auVar23._12_2_ = 0x3333;
  auVar23._14_2_ = 0x3333;
  auVar22._8_2_ = 0x707;
  auVar22._0_8_ = 0x707070707070707;
  auVar22._10_2_ = 0x707;
  auVar22._12_2_ = 0x707;
  auVar22._14_2_ = 0x707;
  auVar24._8_4_ = 0xf;
  auVar24._0_8_ = 0xf0000000f;
  auVar24._12_4_ = 0xf;
  auVar28 = ZEXT1664((undefined1  [16])0x0);
  auVar20 = ZEXT1664((undefined1  [16])0x0);
  auVar21 = ZEXT1664((undefined1  [16])0x0);
  auVar26 = ZEXT1664((undefined1  [16])0x0);
  auVar27 = ZEXT1664((undefined1  [16])0x0);
  uVar4 = 0;
  while (uVar4 < uVar5) {
    uVar6 = uVar4 + 0xffff;
    if (uVar5 - uVar4 < 0x10000) {
      uVar6 = uVar5;
    }
    pauVar9 = (undefined1 (*) [16])(array + uVar4 * 8 + 0x78);
    while( true ) {
      auVar29 = vpsrld_avx(auVar28._0_16_,1);
      auVar14 = vpand_avx(auVar28._0_16_,auVar25);
      if (uVar6 <= uVar4) break;
      auVar10 = vmovdqu64_avx512vl(pauVar9[-0xd]);
      auVar11 = vmovdqu64_avx512vl(pauVar9[-0xc]);
      auVar29 = vpand_avx(auVar29,auVar25);
      uVar4 = uVar4 + 0x10;
      auVar14 = vphaddw_avx(auVar14,auVar29);
      auVar29 = vpsrld_avx(auVar14,2);
      auVar14 = vpand_avx(auVar14,auVar23);
      auVar29 = vpand_avx(auVar29,auVar23);
      auVar14 = vphaddw_avx(auVar14,auVar29);
      auVar29 = vpsrld_avx(auVar14,4);
      auVar14 = vpand_avx(auVar14,auVar22);
      auVar12 = vpxorq_avx512vl(pauVar9[-0xf],auVar27._0_16_);
      auVar29 = vpand_avx(auVar29,auVar22);
      auVar13 = vpandq_avx512vl(auVar12,pauVar9[-0xe]);
      auVar29 = vphaddw_avx(auVar14,auVar29);
      auVar14 = vpternlogq_avx512vl(auVar13,pauVar9[-0xf],auVar27._0_16_,0xf8);
      auVar12 = vpxorq_avx512vl(auVar12,pauVar9[-0xe]);
      auVar13 = vpxorq_avx512vl(auVar12,auVar10);
      auVar15 = vpandq_avx512vl(auVar13,auVar11);
      auVar10 = vpternlogq_avx512vl(auVar15,auVar12,auVar10,0xf8);
      auVar11 = vpxorq_avx512vl(auVar13,auVar11);
      auVar12 = vpxorq_avx512vl(auVar14,auVar26._0_16_);
      auVar13 = vpandq_avx512vl(auVar10,auVar12);
      auVar14 = vpternlogq_avx512vl(auVar13,auVar14,auVar26._0_16_,0xf8);
      auVar13 = vpxorq_avx512vl(auVar11,pauVar9[-0xb]);
      auVar15 = vpandq_avx512vl(auVar13,pauVar9[-10]);
      auVar11 = vpternlogq_avx512vl(auVar15,auVar11,pauVar9[-0xb],0xf8);
      auVar13 = vpxorq_avx512vl(auVar13,pauVar9[-10]);
      auVar15 = vpxorq_avx512vl(auVar13,pauVar9[-9]);
      auVar16 = vpandq_avx512vl(auVar15,pauVar9[-8]);
      auVar13 = vpternlogq_avx512vl(auVar16,auVar13,pauVar9[-9],0xf8);
      auVar16 = vpxorq_avx512vl(auVar11,auVar10 ^ auVar12);
      auVar15 = vpxorq_avx512vl(auVar15,pauVar9[-8]);
      auVar17 = vpandq_avx512vl(auVar13,auVar16);
      auVar10 = vpternlogq_avx512vl(auVar17,auVar11,auVar10 ^ auVar12,0xf8);
      auVar11 = vpxorq_avx512vl(auVar13,auVar16);
      auVar12 = vpxorq_avx512vl(auVar14,auVar21._0_16_);
      auVar13 = vpandq_avx512vl(auVar10,auVar12);
      auVar13 = vpternlogq_avx512vl(auVar13,auVar14,auVar21._0_16_,0xf8);
      auVar14 = vpxorq_avx512vl(auVar10,auVar12);
      auVar10 = vmovdqu64_avx512vl(pauVar9[-6]);
      auVar12 = vpxorq_avx512vl(auVar15,pauVar9[-7]);
      auVar16 = vpandq_avx512vl(auVar12,auVar10);
      auVar15 = vpternlogq_avx512vl(auVar16,auVar15,pauVar9[-7],0xf8);
      auVar10 = vpxorq_avx512vl(auVar12,auVar10);
      auVar12 = vmovdqu64_avx512vl(pauVar9[-4]);
      auVar16 = vpxorq_avx512vl(auVar10,pauVar9[-5]);
      auVar17 = vpandq_avx512vl(auVar16,auVar12);
      auVar10 = vpternlogq_avx512vl(auVar17,auVar10,pauVar9[-5],0xf8);
      auVar17 = vpxorq_avx512vl(auVar15,auVar11);
      auVar12 = vpxorq_avx512vl(auVar16,auVar12);
      auVar16 = vmovdqu64_avx512vl(pauVar9[-2]);
      auVar18 = vpandq_avx512vl(auVar10,auVar17);
      auVar11 = vpternlogq_avx512vl(auVar18,auVar15,auVar11,0xf8);
      auVar10 = vpxorq_avx512vl(auVar10,auVar17);
      auVar15 = vpxorq_avx512vl(auVar12,pauVar9[-3]);
      auVar17 = vpandq_avx512vl(auVar15,auVar16);
      auVar12 = vpternlogq_avx512vl(auVar17,auVar12,pauVar9[-3],0xf8);
      pauVar1 = pauVar9 + -1;
      auVar15 = vpxorq_avx512vl(auVar15,auVar16);
      auVar16 = vmovdqu64_avx512vl(*pauVar9);
      pauVar9 = pauVar9 + 0x10;
      auVar17 = vpxorq_avx512vl(auVar15,*pauVar1);
      auVar18 = vpandq_avx512vl(auVar17,auVar16);
      auVar15 = vpternlogq_avx512vl(auVar18,auVar15,*pauVar1,0xf8);
      auVar18 = vpxorq_avx512vl(auVar12,auVar10);
      auVar16 = vpxorq_avx512vl(auVar17,auVar16);
      auVar27 = ZEXT1664(auVar16);
      auVar16 = vpandq_avx512vl(auVar15,auVar18);
      auVar10 = vpternlogq_avx512vl(auVar16,auVar12,auVar10,0xf8);
      auVar12 = vpxorq_avx512vl(auVar15,auVar18);
      auVar26 = ZEXT1664(auVar12);
      auVar12 = vpxorq_avx512vl(auVar11,auVar14);
      auVar15 = vpandq_avx512vl(auVar10,auVar12);
      auVar11 = vpternlogq_avx512vl(auVar15,auVar11,auVar14,0xf8);
      auVar14 = vpxorq_avx512vl(auVar10,auVar12);
      auVar21 = ZEXT1664(auVar14);
      auVar14 = vpand_avx(auVar29,auVar24);
      counter[0] = (__m128i)vpaddd_avx(auVar14,(undefined1  [16])counter[0]);
      auVar14 = vpsrld_avx(auVar29,8);
      auVar14 = vpand_avx(auVar14,auVar24);
      counter[1] = (__m128i)vpaddd_avx(auVar14,(undefined1  [16])counter[1]);
      auVar14 = vpsrld_avx(auVar29,0x10);
      auVar14 = vpand_avx(auVar14,auVar24);
      counter[2] = (__m128i)vpaddd_avx(auVar14,(undefined1  [16])counter[2]);
      auVar29 = vpsrld_avx(auVar29,0x18);
      auVar14 = auVar13 ^ auVar20._0_16_;
      counter[3] = (__m128i)vpaddd_avx(auVar29,(undefined1  [16])counter[3]);
      auVar29 = vpandq_avx512vl(auVar11,auVar14);
      auVar29 = vpternlogq_avx512vl(auVar29,auVar13,auVar20._0_16_,0xf8);
      auVar28 = ZEXT1664(auVar29);
      auVar14 = vpxorq_avx512vl(auVar11,auVar14);
      auVar20 = ZEXT1664(auVar14);
    }
    auVar29 = vpand_avx(auVar29,auVar25);
    auVar14 = vphaddw_avx(auVar14,auVar29);
    auVar29 = vpsrld_avx(auVar14,2);
    auVar14 = vpand_avx(auVar14,auVar23);
    auVar29 = vpand_avx(auVar29,auVar23);
    auVar14 = vphaddw_avx(auVar14,auVar29);
    auVar29 = vpsrld_avx(auVar14,4);
    auVar14 = vpand_avx(auVar14,auVar22);
    auVar29 = vpand_avx(auVar29,auVar22);
    auVar29 = vphaddw_avx(auVar14,auVar29);
    auVar14 = vpand_avx(auVar29,auVar24);
    counter[0] = (__m128i)vpaddd_avx(auVar14,(undefined1  [16])counter[0]);
    auVar14 = vpsrld_avx(auVar29,8);
    auVar14 = vpand_avx(auVar14,auVar24);
    counter[1] = (__m128i)vpaddd_avx(auVar14,(undefined1  [16])counter[1]);
    auVar14 = vpsrld_avx(auVar29,0x10);
    auVar29 = vpsrld_avx(auVar29,0x18);
    auVar14 = vpand_avx(auVar14,auVar24);
    counter[3] = (__m128i)vpaddd_avx(auVar29,(undefined1  [16])counter[3]);
    counter[2] = (__m128i)vpaddd_avx(auVar14,(undefined1  [16])counter[2]);
  }
  auVar14 = vpslld_avx((undefined1  [16])counter[0],4);
  auVar23 = vpslld_avx((undefined1  [16])counter[2],4);
  auVar24 = vpslld_avx((undefined1  [16])counter[1],4);
  auVar22 = vpslld_avx((undefined1  [16])counter[3],4);
  lVar8 = 0;
  auVar25 = vpunpckldq_avx(auVar14,auVar23);
  auVar25 = vpaddd_avx(auVar25,*(undefined1 (*) [16])flags);
  auVar23 = vpunpckhdq_avx(auVar14,auVar23);
  *(undefined1 (*) [16])flags = auVar25;
  auVar25 = vpaddd_avx(auVar23,*(undefined1 (*) [16])(flags + 4));
  *(undefined1 (*) [16])(flags + 4) = auVar25;
  auVar25 = vpunpckldq_avx(auVar24,auVar22);
  auVar23 = vpunpckhdq_avx(auVar24,auVar22);
  auVar25 = vpaddd_avx(auVar25,*(undefined1 (*) [16])(flags + 8));
  *(undefined1 (*) [16])(flags + 8) = auVar25;
  auVar25 = vpaddd_avx(auVar23,*(undefined1 (*) [16])(flags + 0xc));
  *(undefined1 (*) [16])(flags + 0xc) = auVar25;
  auVar19 = auVar27._0_16_;
  buffer[0] = auVar19[0];
  buffer[1] = auVar19[1];
  buffer[2] = auVar19[2];
  buffer[3] = auVar19[3];
  buffer[4] = auVar19[4];
  buffer[5] = auVar19[5];
  buffer[6] = auVar19[6];
  buffer[7] = auVar19[7];
  for (; lVar8 != 8; lVar8 = lVar8 + 1) {
    uVar2 = buffer[lVar8];
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uint)((uVar2 >> ((uint)lVar7 & 0x1f) & 1) != 0);
    }
  }
  auVar19 = auVar26._0_16_;
  buffer[0] = auVar19[0];
  buffer[1] = auVar19[1];
  buffer[2] = auVar19[2];
  buffer[3] = auVar19[3];
  buffer[4] = auVar19[4];
  buffer[5] = auVar19[5];
  buffer[6] = auVar19[6];
  buffer[7] = auVar19[7];
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    uVar2 = buffer[lVar8];
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + ((uint)(uVar2 >> ((uint)lVar7 & 0x1f)) * 2 & 2);
    }
  }
  auVar19 = auVar21._0_16_;
  buffer[0] = auVar19[0];
  buffer[1] = auVar19[1];
  buffer[2] = auVar19[2];
  buffer[3] = auVar19[3];
  buffer[4] = auVar19[4];
  buffer[5] = auVar19[5];
  buffer[6] = auVar19[6];
  buffer[7] = auVar19[7];
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    uVar2 = buffer[lVar8];
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uVar2 >> ((uint)lVar7 & 0x1f) & 1) * 4;
    }
  }
  auVar19 = auVar20._0_16_;
  buffer[0] = auVar19[0];
  buffer[1] = auVar19[1];
  buffer[2] = auVar19[2];
  buffer[3] = auVar19[3];
  buffer[4] = auVar19[4];
  buffer[5] = auVar19[5];
  buffer[6] = auVar19[6];
  buffer[7] = auVar19[7];
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    uVar2 = buffer[lVar8];
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uVar2 >> ((uint)lVar7 & 0x1f) & 1) * 8;
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_harley_seal_improved(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (16 * 8)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 8;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint16_t buffer[8];
    __m128i counter[4];
    for (size_t i = 0; i < 4; ++i) {
        counter[i] = _mm_setzero_si128();
    }

    while (i < limit) {

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define horizreduce(input, mask, shift, output) \
        __m128i output; \
        { \
            const __m128i tmp0 = _mm_and_si128(input, mask); \
            const __m128i tmp1 = _mm_and_si128(_mm_srli_epi32(input, shift), mask); \
            output = _mm_hadd_epi16(tmp0, tmp1); \
        }

            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);
            {
                horizreduce(v16, _mm_set1_epi8(0x55), 1, t0); // t0 = 2-bit counters
                horizreduce(t0,  _mm_set1_epi8(0x33), 2, t1); // t1 = 4-bit counters
                horizreduce(t1,  _mm_set1_epi8(0x0f), 4, t2); // t2 = 8-bit counters

                const __m128i mask_byte0 = _mm_set1_epi32(0x000000ff);
                counter[0] = _mm_add_epi32(counter[0], t2 & mask_byte0);
                counter[1] = _mm_add_epi32(counter[1], _mm_srli_epi32(t2, 1*8) & mask_byte0);
                counter[2] = _mm_add_epi32(counter[2], _mm_srli_epi32(t2, 2*8) & mask_byte0);
                counter[3] = _mm_add_epi32(counter[3], _mm_srli_epi32(t2, 3*8) & mask_byte0);
            }
            pospopcnt_csa_sse(&v16, &v8, eightsA, eightsB);
        } // for

        // update the counters after the last iteration
        {
            horizreduce(v16, _mm_set1_epi8(0x55), 1, t0);
            horizreduce(t0,  _mm_set1_epi8(0x33), 2, t1);
            horizreduce(t1,  _mm_set1_epi8(0x0f), 4, t2);

            const __m128i mask_byte0 = _mm_set1_epi32(0x000000ff);
            counter[0] = _mm_add_epi32(counter[0], t2 & mask_byte0);
            counter[1] = _mm_add_epi32(counter[1], _mm_srli_epi32(t2, 1*8) & mask_byte0);
            counter[2] = _mm_add_epi32(counter[2], _mm_srli_epi32(t2, 2*8) & mask_byte0);
            counter[3] = _mm_add_epi32(counter[3], _mm_srli_epi32(t2, 3*8) & mask_byte0);
        }
#undef horizreduce
    }

    counter[0] = _mm_slli_epi32(counter[0], 4); // * 16
    counter[1] = _mm_slli_epi32(counter[1], 4); // * 16
    counter[2] = _mm_slli_epi32(counter[2], 4); // * 16
    counter[3] = _mm_slli_epi32(counter[3], 4); // * 16

#if 0 // Left to illustrate the mapping between auxiliary counters and flags.
    flags[0] += _mm_extract_epi32(counter[0], 0);
    flags[1] += _mm_extract_epi32(counter[2], 0);
    flags[2] += _mm_extract_epi32(counter[0], 1);
    flags[3] += _mm_extract_epi32(counter[2], 1);
    flags[4] += _mm_extract_epi32(counter[0], 2);
    flags[5] += _mm_extract_epi32(counter[2], 2);
    flags[6] += _mm_extract_epi32(counter[0], 3);
    flags[7] += _mm_extract_epi32(counter[2], 3);

    flags[8]  += _mm_extract_epi32(counter[1], 0);
    flags[9]  += _mm_extract_epi32(counter[3], 0);
    flags[10] += _mm_extract_epi32(counter[1], 1);
    flags[11] += _mm_extract_epi32(counter[3], 1);
    flags[12] += _mm_extract_epi32(counter[1], 2);
    flags[13] += _mm_extract_epi32(counter[3], 2);
    flags[14] += _mm_extract_epi32(counter[1], 3);
    flags[15] += _mm_extract_epi32(counter[3], 3);
#else
#define update_flags(offset, counters)                  \
    {                                                   \
        __m128i* ptr = (__m128i*)(flags + offset);      \
        const __m128i f = _mm_loadu_si128(ptr);         \
        const __m128i s = _mm_add_epi32(f, counters);   \
        _mm_storeu_si128(ptr, s);                       \
    }
    update_flags(0  /*  0 ..  3 */, _mm_unpacklo_epi32(counter[0], counter[2]));
    update_flags(4  /*  4 ..  7 */, _mm_unpackhi_epi32(counter[0], counter[2]));
    update_flags(8  /*  8 .. 11 */, _mm_unpacklo_epi32(counter[1], counter[3]));
    update_flags(12 /* 12 .. 15 */, _mm_unpackhi_epi32(counter[1], counter[3]));
#undef update_flags
#endif

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}